

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O0

void ncnn::padding_reflect_pack8_int8_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_8;
  int x_7;
  int x_6;
  int64_t *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  int y_1;
  int x_2;
  int x_1;
  int x;
  int64_t *ptr0;
  int y;
  int64_t *outptr;
  int64_t *ptr;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long *local_40;
  int local_34;
  long *local_30;
  long *local_28;
  
  local_28 = Mat::operator_cast_to_long_(in_RDI);
  local_30 = Mat::operator_cast_to_long_(in_RSI);
  local_28 = local_28 + in_EDX * in_RDI->w;
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    local_40 = local_28;
    for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
      *local_30 = local_28[in_R8D - local_44];
      local_30 = local_30 + 1;
    }
    for (local_48 = 0; local_48 < in_RDI->w; local_48 = local_48 + 1) {
      *local_30 = *local_40;
      local_40 = local_40 + 1;
      local_30 = local_30 + 1;
    }
    for (local_4c = 0; local_4c < in_R9D; local_4c = local_4c + 1) {
      *local_30 = local_40[-2 - local_4c];
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + -(long)in_RDI->w;
  }
  for (local_50 = 0; local_50 < in_RDI->h; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < in_R8D; local_54 = local_54 + 1) {
      *local_30 = local_28[in_R8D - local_54];
      local_30 = local_30 + 1;
    }
    for (local_58 = 0; local_58 < in_RDI->w; local_58 = local_58 + 1) {
      *local_30 = *local_28;
      local_30 = local_30 + 1;
      local_28 = local_28 + 1;
    }
    for (local_5c = 0; local_5c < in_R9D; local_5c = local_5c + 1) {
      *local_30 = local_28[-2 - local_5c];
      local_30 = local_30 + 1;
    }
  }
  local_28 = local_28 + -(long)(in_RDI->w << 1);
  for (local_60 = 0; local_60 < in_ECX; local_60 = local_60 + 1) {
    local_68 = local_28;
    for (local_6c = 0; local_6c < in_R8D; local_6c = local_6c + 1) {
      *local_30 = local_28[in_R8D - local_6c];
      local_30 = local_30 + 1;
    }
    for (local_70 = 0; local_70 < in_RDI->w; local_70 = local_70 + 1) {
      *local_30 = *local_68;
      local_68 = local_68 + 1;
      local_30 = local_30 + 1;
    }
    for (local_74 = 0; local_74 < in_R9D; local_74 = local_74 + 1) {
      *local_30 = local_68[-2 - local_74];
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + -(long)in_RDI->w;
  }
  return;
}

Assistant:

static void padding_reflect_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    ptr += top * src.w;
    for (int y = 0; y < top; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr0[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-2 - x];
        }
        ptr -= src.w;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr[-2 - x];
        }
    }
    // fill bottom
    ptr -= 2 * src.w;
    for (int y = 0; y < bottom; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr0[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-2 - x];
        }
        ptr -= src.w;
    }
}